

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O3

void deqp::gles2::Functional::checkFboAttachmentParam
               (TestContext *testCtx,Context *ctx,GLenum attachment,GLenum pname,GLint expectedValue
               )

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  InternalError *this;
  int iVar6;
  char *pcVar7;
  GLint value;
  size_type __dnew;
  char *local_230;
  long local_228;
  undefined7 local_220;
  undefined1 uStack_219;
  undefined2 local_218;
  undefined1 local_216;
  undefined4 uStack_215;
  undefined1 local_211;
  int local_20c;
  TestContext *local_208;
  ulong local_200;
  long local_1f8 [9];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pTVar2 = testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_208 = testCtx;
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"// Querying ",0xc);
  local_200 = (ulong)(uint)expectedValue;
  if (attachment == 0x8ce0) {
    pcVar7 = "GL_COLOR_ATTACHMENT0";
  }
  else if (attachment == 0x8d20) {
    pcVar7 = "GL_STENCIL_ATTACHMENT";
  }
  else {
    if (attachment != 0x8d00) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this,"Unknown attachment",glcts::fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFboApiTest.cpp"
                 ,0x5a);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    pcVar7 = "GL_DEPTH_ATTACHMENT";
  }
  sVar5 = strlen(pcVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar7,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
  pcVar7 = (&PTR__BufferStorageTestCase_020e1ec0)[(int)pname];
  sVar5 = strlen(pcVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar7,sVar5);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  local_20c = -0x32323233;
  (*ctx->_vptr_Context[0x22])(ctx,0x8d40,(ulong)attachment,(ulong)pname);
  iVar4 = (*ctx->_vptr_Context[0x79])(ctx);
  uVar3 = local_200;
  iVar6 = (int)local_200;
  if ((iVar4 == 0) && (local_20c == iVar6)) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"// Pass",7);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    return;
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"// Fail, expected ",0x12);
  if (iVar6 < 0x8515) {
    if (iVar6 == 0) {
      local_220 = 0x454e4f4e5f4c47;
      uStack_219 = 0x28;
      local_218 = 0x2930;
    }
    else {
      if (iVar6 != 0x1702) goto LAB_00fd8ac6;
      local_220 = 0x545845545f4c47;
      uStack_219 = 0x55;
      local_218 = 0x4552;
    }
    local_230 = (char *)&local_220;
    local_228 = 10;
    local_216 = 0;
  }
  else {
    switch(iVar6) {
    case 0x8515:
      local_230 = (char *)&local_220;
      local_1f8[0] = 0x1e;
      local_230 = (char *)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)local_1f8);
      local_220 = (undefined7)local_1f8[0];
      uStack_219 = (undefined1)((ulong)local_1f8[0] >> 0x38);
      builtin_strncpy(local_230 + 0xe,"E_MAP_POSITIVE_X",0x10);
      break;
    case 0x8516:
      local_230 = (char *)&local_220;
      local_1f8[0] = 0x1e;
      local_230 = (char *)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)local_1f8);
      local_220 = (undefined7)local_1f8[0];
      uStack_219 = (undefined1)((ulong)local_1f8[0] >> 0x38);
      builtin_strncpy(local_230 + 0xe,"E_MAP_NEGATIVE_X",0x10);
      break;
    case 0x8517:
      local_230 = (char *)&local_220;
      local_1f8[0] = 0x1e;
      local_230 = (char *)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)local_1f8);
      local_220 = (undefined7)local_1f8[0];
      uStack_219 = (undefined1)((ulong)local_1f8[0] >> 0x38);
      builtin_strncpy(local_230 + 0xe,"E_MAP_POSITIVE_Y",0x10);
      break;
    case 0x8518:
      local_230 = (char *)&local_220;
      local_1f8[0] = 0x1e;
      local_230 = (char *)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)local_1f8);
      local_220 = (undefined7)local_1f8[0];
      uStack_219 = (undefined1)((ulong)local_1f8[0] >> 0x38);
      builtin_strncpy(local_230 + 0xe,"E_MAP_NEGATIVE_Y",0x10);
      break;
    case 0x8519:
      local_230 = (char *)&local_220;
      local_1f8[0] = 0x1e;
      local_230 = (char *)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)local_1f8);
      local_220 = (undefined7)local_1f8[0];
      uStack_219 = (undefined1)((ulong)local_1f8[0] >> 0x38);
      builtin_strncpy(local_230 + 0xe,"E_MAP_POSITIVE_Z",0x10);
      break;
    case 0x851a:
      local_230 = (char *)&local_220;
      local_1f8[0] = 0x1e;
      local_230 = (char *)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)local_1f8);
      local_220 = (undefined7)local_1f8[0];
      uStack_219 = (undefined1)((ulong)local_1f8[0] >> 0x38);
      builtin_strncpy(local_230 + 0xe,"E_MAP_NEGATIVE_Z",0x10);
      break;
    default:
      if (iVar6 == 0x8d41) {
        local_230 = (char *)&local_220;
        local_220 = 0x444e45525f4c47;
        uStack_219 = 0x45;
        local_218 = 0x4252;
        local_216 = 0x55;
        uStack_215 = 0x52454646;
        local_228 = 0xf;
        local_211 = 0;
        goto LAB_00fd8a2d;
      }
LAB_00fd8ac6:
      deSprintf((char *)local_1f8,0x40,"0x%x",uVar3 & 0xffffffff);
      local_230 = (char *)&local_220;
      sVar5 = strlen((char *)local_1f8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,local_1f8,(long)local_1f8 + sVar5);
      goto LAB_00fd8a2d;
    }
    builtin_strncpy(local_230,"GL_TEXTURE_CUBE_",0x10);
    local_230[local_1f8[0]] = '\0';
    local_228 = local_1f8[0];
  }
LAB_00fd8a2d:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_230,local_228);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," without error",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_230 != (char *)&local_220) {
    operator_delete(local_230,CONCAT17(uStack_219,local_220) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  tcu::TestContext::setTestResult
            (local_208,QP_TEST_RESULT_FAIL,"Invalid result for attachment param query");
  return;
}

Assistant:

static void checkFboAttachmentParam (tcu::TestContext& testCtx, sglr::Context& ctx, GLenum attachment, GLenum pname, GLint expectedValue)
{
	TestLog& log = testCtx.getLog();
	log << TestLog::Message << "// Querying " << getAttachmentName(attachment) << " " << getAttachmentParameterName(pname) << TestLog::EndMessage;

	GLint value = 0xcdcdcdcd;
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachment, pname, &value);

	GLenum err = ctx.getError();

	if (value == expectedValue && err == GL_NO_ERROR)
		log << TestLog::Message << "// Pass" << TestLog::EndMessage;
	else
	{
		log << TestLog::Message << "// Fail, expected " << getAttachmentParameterValueName(expectedValue) << " without error" << TestLog::EndMessage;
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid result for attachment param query");
	}
}